

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitSIMDReplace
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,SIMDReplace *curr)

{
  bool bVar1;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *pEVar2;
  Literal *pLVar3;
  Literal local_198;
  Literal local_180;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  Literal local_108;
  undefined1 local_f0 [8];
  Literal value;
  undefined1 local_90 [8];
  Literal vec;
  undefined1 local_68 [8];
  Flow flow;
  SIMDReplace *curr_local;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
  visit((Flow *)local_68,pEVar2,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    vec.type.id._0_4_ = 1;
  }
  else {
    pLVar3 = Flow::getSingleValue((Flow *)local_68);
    ::wasm::Literal::Literal((Literal *)local_90,pLVar3);
    pEVar2 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
    visit((Flow *)&value.type,pEVar2,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x28))
    ;
    Flow::operator=((Flow *)local_68,(Flow *)&value.type);
    Flow::~Flow((Flow *)&value.type);
    bVar1 = Flow::breaking((Flow *)local_68);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
      vec.type.id._0_4_ = 1;
    }
    else {
      pLVar3 = Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::Literal((Literal *)local_f0,pLVar3);
      switch(*(undefined4 *)(flow.breakTo.super_IString.str._M_str + 0x10)) {
      case 0:
        ::wasm::Literal::replaceLaneI8x16(&local_108,(uchar)local_90);
        Flow::Flow(__return_storage_ptr__,&local_108);
        ::wasm::Literal::~Literal(&local_108);
        break;
      case 1:
        ::wasm::Literal::replaceLaneI16x8(&local_120,(uchar)local_90);
        Flow::Flow(__return_storage_ptr__,&local_120);
        ::wasm::Literal::~Literal(&local_120);
        break;
      case 2:
        ::wasm::Literal::replaceLaneI32x4(&local_138,(uchar)local_90);
        Flow::Flow(__return_storage_ptr__,&local_138);
        ::wasm::Literal::~Literal(&local_138);
        break;
      case 3:
        ::wasm::Literal::replaceLaneI64x2(&local_150,(uchar)local_90);
        Flow::Flow(__return_storage_ptr__,&local_150);
        ::wasm::Literal::~Literal(&local_150);
        break;
      case 4:
        ::wasm::Literal::replaceLaneF16x8(&local_168,(uchar)local_90);
        Flow::Flow(__return_storage_ptr__,&local_168);
        ::wasm::Literal::~Literal(&local_168);
        break;
      case 5:
        ::wasm::Literal::replaceLaneF32x4(&local_180,(uchar)local_90);
        Flow::Flow(__return_storage_ptr__,&local_180);
        ::wasm::Literal::~Literal(&local_180);
        break;
      case 6:
        ::wasm::Literal::replaceLaneF64x2(&local_198,(uchar)local_90);
        Flow::Flow(__return_storage_ptr__,&local_198);
        ::wasm::Literal::~Literal(&local_198);
        break;
      default:
        ::wasm::handle_unreachable
                  ("invalid op",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0x4d6);
      }
      vec.type.id._0_4_ = 1;
      ::wasm::Literal::~Literal((Literal *)local_f0);
    }
    ::wasm::Literal::~Literal((Literal *)local_90);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDReplace(SIMDReplace* curr) {
    NOTE_ENTER("SIMDReplace");
    Flow flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    flow = self()->visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    Literal value = flow.getSingleValue();
    switch (curr->op) {
      case ReplaceLaneVecI8x16:
        return vec.replaceLaneI8x16(value, curr->index);
      case ReplaceLaneVecI16x8:
        return vec.replaceLaneI16x8(value, curr->index);
      case ReplaceLaneVecI32x4:
        return vec.replaceLaneI32x4(value, curr->index);
      case ReplaceLaneVecI64x2:
        return vec.replaceLaneI64x2(value, curr->index);
      case ReplaceLaneVecF16x8:
        return vec.replaceLaneF16x8(value, curr->index);
      case ReplaceLaneVecF32x4:
        return vec.replaceLaneF32x4(value, curr->index);
      case ReplaceLaneVecF64x2:
        return vec.replaceLaneF64x2(value, curr->index);
    }
    WASM_UNREACHABLE("invalid op");
  }